

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cc
# Opt level: O0

void __thiscall rcg::GenTLException::~GenTLException(GenTLException *this)

{
  GenTLException *in_RDI;
  
  ~GenTLException(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

GenTLException::~GenTLException()
{ }